

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:286:66)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:286:66)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  long *plVar1;
  undefined8 *puVar2;
  object_ptr o;
  gc_heap_ptr_untyped local_a0;
  undefined1 local_90 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_88;
  vector<mjs::value,_std::allocator<mjs::value>_> local_68;
  value local_50;
  undefined8 local_28;
  wchar_t *local_20;
  
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar1 + 0x88))(&local_a0,plVar1,this_);
  puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&local_a0);
  local_28 = 8;
  local_20 = L"toString";
  (**(code **)*puVar2)(&local_50,puVar2);
  local_90._0_4_ = object;
  local_88.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_a0.heap_;
  local_88.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a0.pos_;
  if (local_a0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)(local_90 + 8));
  }
  local_68.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  call_function(__return_storage_ptr__,&local_50,(value *)local_90,&local_68);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_68);
  value::destroy((value *)local_90);
  value::destroy(&local_50);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }